

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter.c
# Opt level: O0

void aom_lpf_vertical_6_c(uint8_t *s,int pitch,uint8_t *blimit,uint8_t *limit,uint8_t *thresh)

{
  uint8_t p2_00;
  uint8_t p1_00;
  uint8_t p0_00;
  uint8_t q0_00;
  uint8_t q1_00;
  uint8_t q2_00;
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  int in_ESI;
  uint8_t *in_RDI;
  uint8_t *in_R8;
  int8_t flat;
  int8_t mask;
  uint8_t q2;
  uint8_t q1;
  uint8_t q0;
  uint8_t p0;
  uint8_t p1;
  uint8_t p2;
  int count;
  int i;
  int8_t in_stack_ffffffffffffffc5;
  uint8_t in_stack_ffffffffffffffc6;
  int8_t in_stack_ffffffffffffffc7;
  int iVar1;
  int iVar2;
  uint8_t *local_8;
  
  iVar1 = 4;
  local_8 = in_RDI;
  for (iVar2 = 0; iVar2 < iVar1; iVar2 = iVar2 + 1) {
    p2_00 = local_8[-3];
    p1_00 = local_8[-2];
    p0_00 = local_8[-1];
    q0_00 = *local_8;
    q1_00 = local_8[1];
    q2_00 = local_8[2];
    filter_mask3_chroma(*in_RCX,*in_RDX,p2_00,p1_00,p0_00,q0_00,q1_00,q2_00);
    flat_mask3_chroma('\x01',p2_00,p1_00,p0_00,q0_00,q1_00,q2_00);
    filter6(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc5,
            local_8 + 2,local_8 + 1,local_8,(uint8_t *)CONCAT44(iVar2,iVar1),in_R8,in_RCX);
    local_8 = local_8 + in_ESI;
  }
  return;
}

Assistant:

void aom_lpf_vertical_6_c(uint8_t *s, int pitch, const uint8_t *blimit,
                          const uint8_t *limit, const uint8_t *thresh) {
  int i;
  int count = 4;

  for (i = 0; i < count; ++i) {
    const uint8_t p2 = s[-3], p1 = s[-2], p0 = s[-1];
    const uint8_t q0 = s[0], q1 = s[1], q2 = s[2];
    const int8_t mask =
        filter_mask3_chroma(*limit, *blimit, p2, p1, p0, q0, q1, q2);
    const int8_t flat = flat_mask3_chroma(1, p2, p1, p0, q0, q1, q2);
    filter6(mask, *thresh, flat, s - 3, s - 2, s - 1, s, s + 1, s + 2);
    s += pitch;
  }
}